

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_test.c
# Opt level: O3

int test_yajl_map_key(void *ctx,uchar *stringVal,size_t stringLen)

{
  void *__dest;
  
  __dest = malloc(stringLen + 1);
  *(undefined1 *)((long)__dest + stringLen) = 0;
  memcpy(__dest,stringVal,stringLen);
  printf("key: \'%s\'\n",__dest);
  free(__dest);
  return 1;
}

Assistant:

static int test_yajl_map_key(void *ctx, const unsigned char * stringVal,
                             size_t stringLen)
{
    char * str = (char *) malloc(stringLen + 1);
    str[stringLen] = 0;
    memcpy(str, stringVal, stringLen);
    printf("key: '%s'\n", str);
    free(str);
    return 1;
}